

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_busy_timeout(sqlite3 *db,int ms)

{
  int in_ESI;
  long in_RDI;
  _func_int_void_ptr_int *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI < 1) {
    sqlite3_busy_handler
              ((sqlite3 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               (void *)0x14b3c0);
  }
  else {
    sqlite3_busy_handler
              ((sqlite3 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               (void *)0x14b39e);
    *(int *)(in_RDI + 0x2e4) = in_ESI;
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_busy_timeout(sqlite3 *db, int ms){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  if( ms>0 ){
    sqlite3_busy_handler(db, (int(*)(void*,int))sqliteDefaultBusyCallback,
                             (void*)db);
    db->busyTimeout = ms;
  }else{
    sqlite3_busy_handler(db, 0, 0);
  }
  return SQLITE_OK;
}